

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O1

int distmin(int x0,int y0,int x1,int y1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = x0 - x1;
  iVar2 = y0 - y1;
  iVar1 = -iVar3;
  if (0 < iVar3) {
    iVar1 = iVar3;
  }
  iVar3 = -iVar2;
  if (0 < iVar2) {
    iVar3 = iVar2;
  }
  if (iVar3 < iVar1) {
    iVar3 = iVar1;
  }
  return iVar3;
}

Assistant:

int distmin(int x0, int y0, int x1, int y1)
{
    int dx = x0 - x1, dy = y0 - y1;
    if (dx < 0) dx = -dx;
    if (dy < 0) dy = -dy;
  /*  The minimum number of moves to get from (x0,y0) to (x1,y1) is the
   :  larger of the [absolute value of the] two deltas.
   */
    return (dx < dy) ? dy : dx;
}